

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Rollup::CreateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  bool bVar1;
  pointer pRVar2;
  long *in_RDX;
  long in_RSI;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *in_RDI;
  byte in_R8B;
  double dVar3;
  RollupRow *child_row;
  const_iterator it;
  Rollup *base_child;
  int64_t file_total;
  int64_t vm_total;
  value_type *value;
  const_iterator __end1;
  const_iterator __begin1;
  ChildMap *__range1;
  undefined1 in_stack_00000377;
  Options *in_stack_00000378;
  Rollup *in_stack_00000380;
  RollupRow *in_stack_00000388;
  Rollup *in_stack_00000390;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
  *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_68;
  pointer local_60;
  int64_t local_58;
  int64_t local_50;
  reference local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_38;
  pointer *local_30;
  byte local_21;
  long *local_18;
  long local_10;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  if (in_RDX != (long *)0x0) {
    local_10 = in_RSI;
    dVar3 = Percent((long)(((_Tuple_impl<0UL,_bloaty::Rollup_*,_std::default_delete<bloaty::Rollup>_>
                             *)&(in_RDI->
                                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>
                                )._M_impl.super__Vector_impl_data._M_start)->
                          super__Head_base<0UL,_bloaty::Rollup_*,_false>)._M_head_impl - *in_RDX,
                    *in_RDX);
    *(double *)(local_10 + 0x50) = dVar3;
    dVar3 = Percent((long)(in_RDI->
                          super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - local_18[1],local_18[1]);
    *(double *)(local_10 + 0x58) = dVar3;
  }
  local_30 = &in_RDI[1].super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  while (bVar1 = std::__detail::operator!=(&local_38,&local_40), bVar1) {
    local_48 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                            *)0x192e1b);
    pRVar2 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator->
                       ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)0x192e2e
                       );
    local_50 = pRVar2->vm_total_;
    pRVar2 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator->
                       ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)0x192e44
                       );
    local_58 = pRVar2->file_total_;
    local_60 = (pointer)0x0;
    if (local_18 != (long *)0x0) {
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
           ::find(in_stack_ffffffffffffff78,(key_type *)0x192e75);
      in_stack_ffffffffffffff90._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
           ::end(in_stack_ffffffffffffff78);
      bVar1 = std::__detail::operator!=
                        (&local_68,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                          *)&stack0xffffffffffffff90);
      if (bVar1) {
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                      *)0x192eac);
        local_60 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::get
                             ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)
                              in_RDI);
        local_50 = local_50 - local_60->vm_total_;
        local_58 = local_58 - local_60->file_total_;
      }
    }
    if ((local_50 != 0) || (local_58 != 0)) {
      std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                 in_stack_ffffffffffffff90._M_cur,&in_stack_ffffffffffffff88->name);
      in_stack_ffffffffffffff88 =
           std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::back(in_RDI);
      (in_stack_ffffffffffffff88->size).vm = local_50;
      (in_stack_ffffffffffffff88->size).file = local_58;
      if (local_60 != (pointer)0x0) {
        (in_stack_ffffffffffffff88->old_size).vm = local_60->vm_total_;
        (in_stack_ffffffffffffff88->old_size).file = local_60->file_total_;
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                  *)in_RDI);
  }
  SortAndAggregateRows
            (in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378,
             (bool)in_stack_00000377);
  return;
}

Assistant:

void Rollup::CreateRows(RollupRow* row, const Rollup* base,
                        const Options& options, bool is_toplevel) const {
  if (base) {
    // For a diff, the percentage is a comparison against the previous size of
    // the same label at the same level.
    row->vmpercent = Percent(vm_total_ - base->vm_total_, base->vm_total_);
    row->filepercent = Percent(file_total_ - base->file_total_, base->file_total_);
  }

  for (const auto& value : children_) {
    int64_t vm_total = value.second->vm_total_;
    int64_t file_total = value.second->file_total_;
    Rollup* base_child = nullptr;

    if (base) {
      // Reassign sizes to base during a diff to compare to target sizes.
      auto it = base->children_.find(value.first);
      if (it != base->children_.end()) {
        base_child = it->second.get();
        vm_total -= base_child->vm_total_;
        file_total -= base_child->file_total_;
      }
    }

    if (vm_total != 0 || file_total != 0) {
      row->sorted_children.emplace_back(value.first);
      RollupRow& child_row = row->sorted_children.back();
      child_row.size.vm = vm_total;
      child_row.size.file = file_total;

      // Preserve the old size for this label in the RollupRow output.
      // If there is a diff base, the old sizes come from the size of the label
      // in that base.  Otherwise, the old size stays 0.
      if (base_child) {
        child_row.old_size.vm = base_child->vm_total_;
        child_row.old_size.file = base_child->file_total_;
      }
    }
  }

  SortAndAggregateRows(row, base, options, is_toplevel);
}